

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<long>::SolveDirect(TPZMatrix<long> *this,TPZFMatrix<long> *B,DecomposeType dt)

{
  int iVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  
  if (dt == ELDLt) {
    iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1b])(this);
    uVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x46])(this,B);
      uVar2 = 0;
      if (iVar1 != 0) {
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x48])(this,B);
        if (iVar1 != 0) {
          iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x47])(this,B);
          uVar2 = (uint)(iVar1 != 0);
        }
      }
    }
  }
  else {
    if (dt == ECholesky) {
      UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x42];
LAB_00c5fb68:
      iVar1 = (*UNRECOVERED_JUMPTABLE)(this,B);
      return iVar1;
    }
    if (dt == ELU) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
      if (iVar1 != 0) {
        Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
      }
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x17])(this);
      if (iVar1 != 0) {
        UNRECOVERED_JUMPTABLE = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x43];
        goto LAB_00c5fb68;
      }
      uVar2 = 0;
    }
    else {
      Error("Solve  < Unknown decomposition type >",(char *)0x0);
      uVar2 = 0;
    }
  }
  return uVar2;
}

Assistant:

int TPZMatrix<TVar>::SolveDirect( TPZFMatrix<TVar> &B , DecomposeType dt) {
	
	switch ( dt ) {
		case ELU:
			return( Solve_LU( &B)  );
		case ECholesky:
			return( Solve_Cholesky( &B )  );
		case ELDLt:
			return( Solve_LDLt( &B )  );
		default:
			Error( "Solve  < Unknown decomposition type >" );
			break;
	}
	return ( 0 );
}